

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDVertex * __thiscall ON_SubDFace::QuadOppositeVertex(ON_SubDFace *this,ON_SubDVertex *vertex)

{
  ulong uVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDVertex *pOVar3;
  uint uVar4;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar5;
  
  if (vertex != (ON_SubDVertex *)0x0) {
    if (this->m_edge_count != 4) {
      return (ON_SubDVertex *)0x0;
    }
    uVar5 = this->m_edge4[0].m_ptr;
    uVar8 = uVar5 & 0xfffffffffffffff8;
    if (uVar8 != 0) {
      uVar1 = this->m_edge4[2].m_ptr;
      uVar6 = uVar1 & 0xfffffffffffffff8;
      if (uVar6 != 0) {
        uVar7 = (uint)uVar5 & 1;
        uVar4 = (uint)uVar1 & 1;
        uVar5 = (ulong)uVar4;
        pOVar2 = *(ON_SubDVertex **)(uVar8 + 0x80 + (ulong)uVar7 * 8);
        if (pOVar2 != vertex) {
          pOVar3 = *(ON_SubDVertex **)(uVar8 + 0x80 + (ulong)(uVar7 ^ 1) * 8);
          if (pOVar3 != vertex) {
            if (*(ON_SubDVertex **)(uVar6 + 0x80 + uVar5 * 8) == vertex) {
              return pOVar2;
            }
            if (*(ON_SubDVertex **)(uVar6 + 0x80 + (ulong)(uVar4 ^ 1) * 8) == vertex) {
              return pOVar3;
            }
            goto LAB_005d7d5b;
          }
          uVar5 = (ulong)(uVar4 ^ 1);
        }
        return *(ON_SubDVertex **)(uVar6 + 0x80 + uVar5 * 8);
      }
    }
  }
LAB_005d7d5b:
  ON_SubDIncrementErrorCount();
  return (ON_SubDVertex *)0x0;
}

Assistant:

const ON_SubDVertex* ON_SubDFace::QuadOppositeVertex(
  const ON_SubDVertex* vertex
  ) const
{
  if ( nullptr == vertex )
    return ON_SUBD_RETURN_ERROR(nullptr);
  if ( 4 != m_edge_count)
    return nullptr; // not an error
  
  ON__UINT_PTR ptr0 = m_edge4[0].m_ptr;
  const ON_SubDEdge* e0 = ON_SUBD_EDGE_POINTER(ptr0);
  if ( nullptr == e0 )
    return ON_SUBD_RETURN_ERROR(nullptr);
  ptr0 = ON_SUBD_EDGE_DIRECTION(ptr0);
  
  ON__UINT_PTR ptr2 = m_edge4[2].m_ptr;
  const ON_SubDEdge* e2 = ON_SUBD_EDGE_POINTER(ptr2);
  if ( nullptr == e2 )
    return ON_SUBD_RETURN_ERROR(nullptr);
  ptr2 = ON_SUBD_EDGE_DIRECTION(ptr2);

  if (vertex == e0->m_vertex[ptr0])
    return e2->m_vertex[ptr2];

  if (vertex == e0->m_vertex[1-ptr0])
    return e2->m_vertex[1-ptr2];

  if (vertex == e2->m_vertex[ptr2])
    return e0->m_vertex[ptr0];

  if (vertex == e2->m_vertex[1-ptr2])
    return e0->m_vertex[1-ptr0];

  return ON_SUBD_RETURN_ERROR(nullptr);
}